

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O3

int mraa_led_read_brightness(mraa_led_context dev)

{
  int iVar1;
  mraa_result_t mVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  char buf [3];
  char local_b [3];
  
  if (dev == (mraa_led_context)0x0) {
    syslog(3,"led: read_brightness: context is invalid");
    iVar1 = 5;
  }
  else {
    if (dev->trig_fd != -1) {
      close(dev->trig_fd);
      dev->trig_fd = -1;
    }
    if (dev->max_bright_fd != -1) {
      close(dev->max_bright_fd);
      dev->max_bright_fd = -1;
    }
    if (dev->bright_fd == -1) {
      mVar2 = mraa_led_get_brightfd(dev);
      if (mVar2 != MRAA_SUCCESS) {
        return 7;
      }
    }
    else {
      lseek(dev->bright_fd,0,0);
    }
    sVar3 = read(dev->bright_fd,local_b,3);
    if (sVar3 == -1) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      syslog(3,"led: read_brightness: Failed to read \'brightness\': %s",pcVar5);
      iVar1 = 99;
    }
    else {
      lseek(dev->bright_fd,0,0);
      iVar1 = atoi(local_b);
    }
  }
  return iVar1;
}

Assistant:

int
mraa_led_read_brightness(mraa_led_context dev)
{
    char buf[3];

    if (dev == NULL) {
        syslog(LOG_ERR, "led: read_brightness: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (dev->trig_fd != -1) {
        close(dev->trig_fd);
        dev->trig_fd = -1;
    }

    if (dev->max_bright_fd != -1) {
        close(dev->max_bright_fd);
        dev->max_bright_fd = -1;
    }

    if (dev->bright_fd == -1) {
        if (mraa_led_get_brightfd(dev) != MRAA_SUCCESS) {
            return MRAA_ERROR_INVALID_RESOURCE;
        }
    } else {
        lseek(dev->bright_fd, 0, SEEK_SET);
    }

    if (read(dev->bright_fd, buf, 3 * sizeof(char)) == -1) {
        syslog(LOG_ERR, "led: read_brightness: Failed to read 'brightness': %s", strerror(errno));
        return MRAA_ERROR_UNSPECIFIED;
    }
    lseek(dev->bright_fd, 0, SEEK_SET);

    return (int) atoi(buf);
}